

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O1

void __thiscall QWidgetRepaintManager::flush(QWidgetRepaintManager *this)

{
  long lVar1;
  QWidgetPrivate *this_00;
  __uniq_ptr_data<QTLWExtra,_std::default_delete<QTLWExtra>,_true,_true> _Var2;
  QWidget *pQVar3;
  undefined8 uVar4;
  QArrayData *pQVar5;
  undefined8 uVar6;
  int *piVar7;
  QDebug QVar8;
  char cVar9;
  Stream *__old_val;
  QLoggingCategory *pQVar10;
  QPlatformTextureList *pQVar11;
  iterator iVar12;
  iterator iVar13;
  long in_FS_OFFSET;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QList<QWidget_*> __old_val_1;
  QList<QWidget_*> local_a8;
  char *local_90;
  QDebug local_80;
  QRegion local_78;
  QDebug local_70;
  QDebug local_68;
  QtPrivate local_60 [8];
  QArrayDataPointer<QWidget_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar10 = QtPrivateLogging::lcWidgetPainting();
  if (((pQVar10->field_2).bools.enabledInfo._q_value._M_base._M_i & 1U) != 0) {
    local_90 = pQVar10->name;
    local_a8.d.d._0_4_ = 2;
    local_a8.d.d._4_4_ = 0;
    local_a8.d.ptr._0_4_ = 0;
    local_a8.d.ptr._4_4_ = 0;
    local_a8.d.size._0_4_ = 0;
    local_a8.d.size._4_4_ = 0;
    QMessageLogger::info();
    QVar8.stream = local_80.stream;
    QVar14.m_data = (storage_type *)0x12;
    QVar14.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar14);
    QTextStream::operator<<((QTextStream *)QVar8.stream,(QString *)&local_58);
    if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_80.stream,' ');
    }
    local_78.d = (QRegionData *)local_80.stream;
    *(int *)(local_80.stream + 0x28) = *(int *)(local_80.stream + 0x28) + 1;
    ::operator<<((Stream *)&local_70,&local_78);
    QVar8.stream = local_70.stream;
    QVar15.m_data = (storage_type *)0xc;
    QVar15.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar15);
    QTextStream::operator<<((QTextStream *)QVar8.stream,(QString *)&local_58);
    if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
      }
    }
    if ((char)(((QArrayData *)(local_70.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_70.stream,' ');
    }
    *(int *)(local_70.stream + 0x28) = *(int *)(local_70.stream + 0x28) + 1;
    local_68.stream = (Stream *)0x0;
    local_58.d = (Data *)local_70.stream;
    QtPrivate::printSequentialContainer<QList<QWidget*>>
              (local_60,(Stream *)&local_58,"QList",(QList<QWidget_*> *)(this + 0x50));
    QDebug::~QDebug((QDebug *)&local_58);
    QDebug::~QDebug((QDebug *)local_60);
    QDebug::~QDebug(&local_68);
    QDebug::~QDebug(&local_70);
    QDebug::~QDebug((QDebug *)&local_78);
    QDebug::~QDebug(&local_80);
  }
  lVar1 = *(long *)(this + 0x60);
  cVar9 = QRegion::isEmpty();
  if (cVar9 == '\0') {
    pQVar3 = *(QWidget **)this;
    pQVar11 = widgetTexturesFor(pQVar3,pQVar3);
    flush(this,pQVar3,(QRegion *)(this + 0x48),pQVar11);
    QRegion::QRegion((QRegion *)&local_a8);
    uVar4 = *(undefined8 *)(this + 0x48);
    *(ulong *)(this + 0x48) = CONCAT44(local_a8.d.d._4_4_,local_a8.d.d._0_4_);
    local_a8.d.d._0_4_ = (undefined4)uVar4;
    local_a8.d.d._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
LAB_0031d883:
    QRegion::~QRegion((QRegion *)&local_a8);
LAB_0031d888:
    if (lVar1 == 0) goto LAB_0031d9ab;
  }
  else if (lVar1 == 0) {
    this_00 = *(QWidgetPrivate **)(*(long *)this + 8);
    QWidgetPrivate::createTLExtra(this_00);
    _Var2.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
    super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
    super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
         (((this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
         super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>;
    if (*(long *)((long)_Var2.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t
                        .super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                        super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 200) !=
        *(long *)((long)_Var2.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t
                        .super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                        super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xd0)) {
      pQVar11 = widgetTexturesFor(*(QWidget **)this,*(QWidget **)this);
      if (pQVar11 != (QPlatformTextureList *)0x0) {
        pQVar3 = *(QWidget **)this;
        QRegion::QRegion((QRegion *)&local_a8);
        flush(this,pQVar3,(QRegion *)&local_a8,pQVar11);
        goto LAB_0031d883;
      }
    }
    goto LAB_0031d888;
  }
  local_58.size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (QWidget **)0x0;
  uVar4 = *(undefined8 *)(this + 0x50);
  uVar6 = *(undefined8 *)(this + 0x58);
  *(undefined8 *)(this + 0x50) = 0;
  *(undefined8 *)(this + 0x58) = 0;
  local_a8.d.d._0_4_ = (undefined4)uVar4;
  local_a8.d.d._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
  local_a8.d.ptr._0_4_ = (undefined4)uVar6;
  local_a8.d.ptr._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
  uVar4 = *(undefined8 *)(this + 0x60);
  *(undefined8 *)(this + 0x60) = 0;
  local_a8.d.size._0_4_ = (undefined4)uVar4;
  local_a8.d.size._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
  QArrayDataPointer<QWidget_*>::operator=((QArrayDataPointer<QWidget_*> *)(this + 0x50),&local_58);
  if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d)->super_QArrayData,8,0x10);
    }
  }
  iVar12 = QList<QWidget_*>::begin(&local_a8);
  iVar13 = QList<QWidget_*>::end(&local_a8);
  if (iVar12.i != iVar13.i) {
    do {
      pQVar3 = *iVar12.i;
      lVar1 = *(long *)&pQVar3->field_0x8;
      if ((*(byte *)(lVar1 + 0x253) & 2) == 0) {
        pQVar11 = (QPlatformTextureList *)0x0;
      }
      else {
        pQVar11 = widgetTexturesFor(*(QWidget **)this,pQVar3);
      }
      flush(this,pQVar3,*(QRegion **)(lVar1 + 0xa0),pQVar11);
      QRegion::QRegion((QRegion *)&local_58);
      pQVar5 = (QArrayData *)**(undefined8 **)(lVar1 + 0xa0);
      **(undefined8 **)(lVar1 + 0xa0) = local_58.d;
      local_58.d = (Data *)pQVar5;
      QRegion::~QRegion((QRegion *)&local_58);
      iVar12.i = iVar12.i + 1;
    } while (iVar12.i != iVar13.i);
  }
  piVar7 = (int *)CONCAT44(local_a8.d.d._4_4_,local_a8.d.d._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_a8.d.d._4_4_,local_a8.d.d._0_4_),8,0x10);
    }
  }
LAB_0031d9ab:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetRepaintManager::flush()
{
    qCInfo(lcWidgetPainting) << "Flushing top level"
        << topLevelNeedsFlush << "and children" << needsFlushWidgets;

    const bool hasNeedsFlushWidgets = !needsFlushWidgets.isEmpty();
    bool flushed = false;

    // Flush the top level widget
    if (!topLevelNeedsFlush.isEmpty()) {
        flush(tlw, topLevelNeedsFlush, widgetTexturesFor(tlw, tlw));
        topLevelNeedsFlush = QRegion();
        flushed = true;
    }

    // Render-to-texture widgets are not in topLevelNeedsFlush so flush if we have not done it above.
    if (!flushed && !hasNeedsFlushWidgets) {
        if (!tlw->d_func()->topData()->widgetTextures.empty()) {
            if (QPlatformTextureList *widgetTextures = widgetTexturesFor(tlw, tlw))
                flush(tlw, QRegion(), widgetTextures);
        }
    }

    if (!hasNeedsFlushWidgets)
        return;

    for (QWidget *w : std::exchange(needsFlushWidgets, {})) {
        QWidgetPrivate *wd = w->d_func();
        Q_ASSERT(wd->needsFlush);
        QPlatformTextureList *widgetTexturesForNative = wd->textureChildSeen ? widgetTexturesFor(tlw, w) : nullptr;
        flush(w, *wd->needsFlush, widgetTexturesForNative);
        *wd->needsFlush = QRegion();
    }
}